

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Vector3<float> pbrt::Cross<float>(Vector3<float> *v,Vector3<float> *w)

{
  Tuple3<pbrt::Vector3,_float> TVar1;
  undefined8 in_RSI;
  float x;
  float y;
  Vector3<float> *in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined8 local_c;
  undefined4 local_4;
  
  x = DifferenceOfProducts<float,float,float,float>
                ((float)((ulong)in_RSI >> 0x20),(float)in_RSI,in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8);
  y = DifferenceOfProducts<float,float,float,float>
                ((float)((ulong)in_RSI >> 0x20),(float)in_RSI,in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8);
  DifferenceOfProducts<float,float,float,float>
            ((float)((ulong)in_RSI >> 0x20),(float)in_RSI,in_stack_ffffffffffffffdc,
             in_stack_ffffffffffffffd8);
  Vector3<float>::Vector3(in_stack_ffffffffffffffd0,x,y,0.0);
  TVar1.z = local_4;
  TVar1._0_8_ = local_c;
  return (Vector3<float>)TVar1;
}

Assistant:

PBRT_CPU_GPU inline Vector3<T> Cross(const Vector3<T> &v, const Vector3<T> &w) {
    DCHECK(!v.HasNaN() && !w.HasNaN());
    return {DifferenceOfProducts(v.y, w.z, v.z, w.y),
            DifferenceOfProducts(v.z, w.x, v.x, w.z),
            DifferenceOfProducts(v.x, w.y, v.y, w.x)};
}